

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O3

int self_server_register_format(FMContext fmc,FMFormat_conflict fmformat)

{
  int iVar1;
  char *extraout_RAX;
  char *pcVar2;
  format_rep server_format_rep;
  char buffer [256];
  char acStack_108 [256];
  
  do {
    fmc = fmc->master_context;
  } while (fmc != (FMContext)0x0);
  server_format_rep = fmformat->server_format_rep;
  if (server_format_rep == (format_rep)0x0) {
    build_server_format_rep(fmformat);
    server_format_rep = fmformat->server_format_rep;
  }
  generate_format3_server_ID(&fmformat->server_ID,server_format_rep);
  pcVar2 = extraout_RAX;
  if (format_server_verbose == -1) {
    pcVar2 = getenv("FORMAT_SERVER_VERBOSE");
    format_server_verbose = (int)(pcVar2 != (char *)0x0);
  }
  iVar1 = (int)pcVar2;
  if (format_server_verbose != 0) {
    printf("Registering %s to locally-issued format ID ",fmformat->format_name);
    stringify_server_ID((uchar *)(fmformat->server_ID).value,acStack_108,0x100);
    printf("%s",acStack_108);
    iVar1 = putchar(10);
  }
  return iVar1;
}

Assistant:

static int
self_server_register_format(FMContext fmc, FMFormat fmformat)
{
    format_rep server_format_rep;
    /* we're a format server ourselves, assign an ID */
    if (fmc->master_context != NULL) {
	return self_server_register_format((FMContext) fmc->master_context,
					   fmformat);
    }
    if (fmformat->context != fmc) {
	/* registering in a master, copy it down */
	assert(0);
    }
    if (fmformat->server_format_rep == NULL) {
	server_format_rep = build_server_format_rep(fmformat);
    }
    server_format_rep = fmformat->server_format_rep;

    generate_format3_server_ID(&fmformat->server_ID, server_format_rep);
    if (get_format_server_verbose()) {
	printf("Registering %s to locally-issued format ID ",
	       fmformat->format_name);
	print_format_ID(fmformat);
	printf("\n");
    }
    return 1;
}